

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Reader::InitBuffer(BP3Reader *this)

{
  ulong uVar1;
  bool isStep;
  size_t sVar2;
  long in_RDI;
  size_t metadataSize;
  size_t metadataStart;
  size_t miniFooterStart;
  string err;
  size_t miniFooterSize;
  size_t fileSize;
  BufferSTL *in_stack_fffffffffffffcd8;
  BP3Deserializer *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  int commRank;
  allocator *paVar3;
  string *in_stack_fffffffffffffd28;
  Engine *in_stack_fffffffffffffd30;
  BufferSTL *in_stack_fffffffffffffd38;
  BP3Deserializer *in_stack_fffffffffffffd40;
  Engine *in_stack_fffffffffffffd48;
  Engine *in_stack_fffffffffffffd50;
  allocator *buffer;
  TransportMan *in_stack_fffffffffffffd60;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  IO *in_stack_fffffffffffffde0;
  allocator<char> local_211;
  string local_210 [16];
  string *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  BufferSTL *in_stack_fffffffffffffe10;
  string local_1e8 [32];
  BP3Deserializer *local_1c8;
  allocator<char> local_1b9;
  string local_1b8 [8];
  string *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  size_t in_stack_fffffffffffffe60;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [48];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  Engine *local_18;
  Engine *local_10;
  
  if (*(int *)(in_RDI + 0xd0 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18)) == 0) {
    local_10 = (Engine *)
               transportman::TransportMan::GetFileSize
                         ((TransportMan *)in_stack_fffffffffffffd50,
                          (size_t)in_stack_fffffffffffffd48);
    local_18 = (Engine *)
               (ulong)*(uint *)(in_RDI + 600 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18));
    if (local_10 < local_18) {
      std::operator+((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      commRank = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
      std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd18);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd18);
      std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
      std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"Engine",&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"BP3Reader",&local_191);
      in_stack_fffffffffffffd60 = (TransportMan *)&local_1b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Init",(allocator *)in_stack_fffffffffffffd60);
      helper::Throw<std::logic_error>
                ((string *)in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38,
                 (string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,commRank);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::~string(local_38);
    }
    buffer = (allocator *)&stack0xfffffffffffffe17;
    in_stack_fffffffffffffd48 = local_10;
    in_stack_fffffffffffffd50 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8," fileSize < miniFooterSize, in call to Open",buffer);
    in_stack_fffffffffffffd40 =
         (BP3Deserializer *)
         helper::GetDistance(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
    in_stack_fffffffffffffd38 = (BufferSTL *)&local_211;
    in_stack_fffffffffffffd30 = local_18;
    local_1c8 = in_stack_fffffffffffffd40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"allocating metadata buffer to inspect bp minifooter, in call to Open",
               (allocator *)in_stack_fffffffffffffd38);
    adios2::format::BufferSTL::Resize
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator(&local_211);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x9ebdfa);
    transportman::TransportMan::ReadFile
              (in_stack_fffffffffffffd60,(char *)buffer,(size_t)in_stack_fffffffffffffd50,
               (size_t)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
    in_stack_fffffffffffffde0 =
         (IO *)adios2::format::BP3Deserializer::MetadataStart
                         (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    paVar3 = &local_249;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248," fileSize < miniFooterSize, in call to Open",paVar3);
    sVar2 = helper::GetDistance(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                                in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    unique0x10000865 = sVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"allocating metadata buffer, in call to Open",&local_271)
    ;
    adios2::format::BufferSTL::Resize
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x9ebf9d);
    transportman::TransportMan::ReadFile
              (in_stack_fffffffffffffd60,(char *)buffer,(size_t)in_stack_fffffffffffffd50,
               (size_t)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
  }
  helper::Comm::BroadcastVector<char>
            ((Comm *)in_stack_fffffffffffffd50,
             (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd48,
             (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  adios2::format::BP3Deserializer::ParseMetadata
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  sVar2 = stack0xfffffffffffffdd8;
  uVar1 = stack0xfffffffffffffdd8 >> 0x38;
  isStep = SUB81(uVar1,0);
  unique0x1000086d = sVar2;
  IO::SetPrefixedNames(in_stack_fffffffffffffde0,isStep);
  return;
}

Assistant:

void BP3Reader::InitBuffer()
{
    if (m_BP3Deserializer.m_RankMPI == 0)
    {
        const size_t fileSize = m_FileManager.GetFileSize();
        // handle single bp files from ADIOS 1.x by getting onl the metadata in
        // buffer

        // Load/Read Minifooter
        const size_t miniFooterSize = m_BP3Deserializer.m_MetadataSet.MiniFooterSize;
        if (fileSize < miniFooterSize)
        {
            std::string err = "The size of the input file " + m_Name + "(" +
                              std::to_string(fileSize) +
                              " bytes) is less than the minimum BP3 header "
                              "size, which is " +
                              std::to_string(miniFooterSize) + " bytes." +
                              " It is unlikely that this is a .bp file.";
            helper::Throw<std::logic_error>("Engine", "BP3Reader", "Init", err);
        }
        const size_t miniFooterStart = helper::GetDistance(
            fileSize, miniFooterSize, " fileSize < miniFooterSize, in call to Open");

        m_BP3Deserializer.m_Metadata.Resize(
            miniFooterSize, "allocating metadata buffer to inspect bp minifooter, in call to "
                            "Open");

        m_FileManager.ReadFile(m_BP3Deserializer.m_Metadata.m_Buffer.data(), miniFooterSize,
                               miniFooterStart);

        // Load/Read Metadata
        const size_t metadataStart = m_BP3Deserializer.MetadataStart(m_BP3Deserializer.m_Metadata);
        const size_t metadataSize = helper::GetDistance(
            fileSize, metadataStart, " fileSize < miniFooterSize, in call to Open");

        m_BP3Deserializer.m_Metadata.Resize(metadataSize,
                                            "allocating metadata buffer, in call to Open");

        m_FileManager.ReadFile(m_BP3Deserializer.m_Metadata.m_Buffer.data(), metadataSize,
                               metadataStart);
    }

    // broadcast metadata buffer to all ranks from zero
    m_Comm.BroadcastVector(m_BP3Deserializer.m_Metadata.m_Buffer);

    // fills IO with available Variables and Attributes
    m_BP3Deserializer.ParseMetadata(m_BP3Deserializer.m_Metadata, *this);
    // caches attributes associated with variables
    m_IO.SetPrefixedNames(false);
}